

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O1

void __thiscall QCborStreamReader::addData(QCborStreamReader *this,char *data,qsizetype len)

{
  if (**(long **)(this + 8) == 0) {
    if (0 < len) {
      QByteArray::append((QByteArray *)(*(long **)(this + 8) + 1),data,len);
    }
    reparse(this);
    return;
  }
  addData();
  return;
}

Assistant:

void QCborStreamReader::addData(const char *data, qsizetype len)
{
    if (!d->device) {
        if (len > 0)
            d->buffer.append(data, len);
        reparse();
    } else {
        qWarning("QCborStreamReader: addData() with device()");
    }
}